

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O0

int __thiscall H264StreamReader::getNalHrdLen(H264StreamReader *this,uint8_t *nal)

{
  uint8_t *nal_local;
  H264StreamReader *this_local;
  
  if (((2 < (long)(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd - (long)nal) &&
      (*nal == '\0')) && (nal[1] == '\0')) {
    if (nal[2] == '\x01') {
      return 3;
    }
    if ((3 < (long)(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd - (long)nal)
       && (nal[3] == '\x01')) {
      return 4;
    }
  }
  return 0;
}

Assistant:

int H264StreamReader::getNalHrdLen(const uint8_t *nal) const
{
    if (m_bufEnd - nal >= 3)
    {
        if (nal[0] == 0 && nal[1] == 0)
        {
            if (nal[2] == 1)
                return 3;
            if (m_bufEnd - nal >= 4 && nal[3] == 1)
                return 4;
        }
    }
    return 0;
}